

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstr.cpp
# Opt level: O3

void __thiscall NaCSTRFunc::NaCSTRFunc(NaCSTRFunc *this,char *szOptions,NaVector *vInit)

{
  NaParams **ppNVar1;
  double dVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  undefined8 *puVar6;
  char *pcVar7;
  char *pcVar8;
  NaParams *this_00;
  NaDataFile *pNVar9;
  int i;
  ulong uVar10;
  
  NaExternFunc::NaExternFunc(&this->super_NaExternFunc);
  *(undefined ***)this = &PTR_PrintLog_00104d30;
  this->par = (NaParams *)0x0;
  this->out = (NaDataFile *)0x0;
  (this->ini).state[0] = 0.4915;
  (this->ini).state[1] = 2.0042;
  *(undefined4 *)((long)&this->ini + 0x10) = 0x98c7e282;
  *(undefined4 *)((long)&this->ini + 0x14) = 0x3ffb96bb;
  *(undefined4 *)((long)&this->ini + 0x18) = 0x8f5c28f6;
  *(undefined4 *)((long)&this->ini + 0x1c) = 0x4076b9c2;
  (this->ini).state[4] = 350.15;
  iVar4 = (**(code **)(*(long *)vInit + 0x30))(vInit);
  if (iVar4 == 5) {
    uVar10 = 0;
    while( true ) {
      uVar5 = (**(code **)(*(long *)vInit + 0x30))(vInit);
      if (uVar5 <= uVar10) break;
      puVar6 = (undefined8 *)(**(code **)(*(long *)vInit + 0x40))(vInit,uVar10 & 0xffffffff);
      *(undefined8 *)((long)&this->ini + uVar10 * 8) = *puVar6;
      uVar10 = uVar10 + 1;
    }
  }
  NaPrintLog("cstr: initial state: c_A=%g, c_B=%g, c_C=%g, T=%g, T_c=%g\n",
             (int)*(undefined8 *)&this->ini,(this->ini).state[1],(this->ini).state[2],
             (this->ini).state[3],(this->ini).state[4]);
  this->q = 0.015;
  this->V = 0.23;
  this->V_c = 0.21;
  this->rho = 1020.0;
  this->rho_c = 998.0;
  this->Cp = 4.02;
  this->Cp_c = 4.182;
  this->A = 1.51;
  this->k = (NaReal)0x4045666666666666;
  this->k10 = 155000000000.0;
  this->k20 = 4.55e+25;
  this->drH_1 = -86000.0;
  this->c_Av = 4.22;
  this->c_Bv = 0.0;
  this->c_Cv = 0.0;
  this->T_v = 328.0;
  this->T_vc = 298.0;
  this->q_sc = 0.004;
  this->E1R = 9850.0;
  this->E2R = 22019.0;
  pcVar7 = strdup(szOptions);
  pcVar7 = strtok(pcVar7," ");
  pcVar8 = strtok((char *)0x0," ");
  if (pcVar7 == (char *)0x0) {
    NaPrintLog("cstr: no parameters file is specified; using defaults\n");
  }
  else {
    ppNVar1 = &this->par;
    NaPrintLog("cstr: try to open parameters in file \'%s\'\n",pcVar7);
    this_00 = (NaParams *)operator_new(0x420);
    NaParams::NaParams(this_00,pcVar7,0,(char **)0x0,"#=");
    *ppNVar1 = this_00;
    cVar3 = NaParams::CheckParam((char *)this_00);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->q,0),"q");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->q = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->V,0),"V");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->V = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->V_c,0),"V_c");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->V_c = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->rho,0),"rho");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->rho = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->rho_c,0),
                 "rho_c");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->rho_c = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->Cp,0),"Cp");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->Cp = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->Cp_c,0),"Cp_c")
      ;
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->Cp_c = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->A,0),"A");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->A = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->k,0),"k");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->k = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->k10,0),"k10");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->k10 = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->k20,0),"k20");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->k20 = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->drH_1,0),
                 "drH_1");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->drH_1 = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->drH_2,0),
                 "drH_2");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->drH_2 = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->c_Av,0),"c_Av")
      ;
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->c_Av = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->c_Bv,0),"c_Bv")
      ;
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->c_Bv = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->c_Cv,0),"c_Cv")
      ;
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->c_Cv = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->T_v,0),"T_v");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->T_v = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->T_vc,0),"T_vc")
      ;
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->T_vc = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->E1R,0),"E1R");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->E1R = dVar2;
    }
    cVar3 = NaParams::CheckParam((char *)*ppNVar1);
    if (cVar3 == '\0') {
      NaPrintLog("cstr: \'%s\' is not defined; using default value %g\n",SUB84(this->E2R,0),"E2R");
    }
    else {
      pcVar7 = (char *)NaParams::GetParam((char *)*ppNVar1);
      dVar2 = atof(pcVar7);
      this->E2R = dVar2;
    }
  }
  if (pcVar8 != (char *)0x0) {
    NaPrintLog("cstr: state output file parametrs file is \'%s\'\n");
    pNVar9 = (NaDataFile *)OpenOutputDataFile(pcVar8,bdtAuto,0);
    this->out = pNVar9;
  }
  return;
}

Assistant:

NaCSTRFunc::NaCSTRFunc (char* szOptions, NaVector& vInit)
    : par(NULL), out(NULL)
{
    ini.var.c_A = 0.4915;
    ini.var.c_B = 2.0042;
    ini.var.c_C = 1.7243;
    ini.var.T   = 363.61;
    ini.var.T_c = 350.15;

    if(vInit.dim() == sizeof(ini.state)/sizeof(ini.state[0])) {
	for(int i = 0; i < vInit.dim(); ++i) {
	    ini.state[i] = vInit[i];
	}
    }
    NaPrintLog("cstr: initial state: c_A=%g, c_B=%g, c_C=%g, T=%g, T_c=%g\n",
	       ini.var.c_A, ini.var.c_B, ini.var.c_C, ini.var.T, ini.var.T_c);

    q = 0.015;
    V = 0.23;
    V_c = 0.21;
    rho = 1020;
    rho_c = 998;
    Cp = 4.02;
    Cp_c = 4.182;
    A = 1.51;
    k = 42.8;
    k10 = 1.55e11;
    k20 = 4.55e25;
    drH_1 = -8.6e4;
    drH_2 -1.82e4;
    c_Av = 4.22;
    c_Bv = 0;
    c_Cv = 0;
    T_v = 328;
    T_vc = 298;
    q_sc = 0.004;
    E1R = 9850;
    E2R = 22019;

    char *szBuffer = strdup(szOptions);
    char *szParFile = strtok(szBuffer, " ");
    char *szOutFile = strtok(NULL, " ");
    if(NULL == szParFile) {
	NaPrintLog("cstr: no parameters file is specified; using defaults\n");
    } else {
	try{
	    NaPrintLog("cstr: try to open parameters in file '%s'\n", szParFile);
	    par = new NaParams(szParFile);
	} catch(...) {
	    NaPrintLog("cstr: failed to open parameters file '%s'; using defaults\n", szParFile);
	    par = NULL;
	}
	if(NULL != par) {
#define CHECKPAR(x) if(!par->CheckParam(#x))NaPrintLog("cstr: '%s' is not defined; using default value %g\n",#x,x);
#define SETPAR(x) CHECKPAR(x) else x=atof(par->GetParam(#x))
	    SETPAR(q);
	    SETPAR(V);
	    SETPAR(V_c);
	    SETPAR(rho);
	    SETPAR(rho_c);
	    SETPAR(Cp);
	    SETPAR(Cp_c);
	    SETPAR(A);
	    SETPAR(k);
	    SETPAR(k10);
	    SETPAR(k20);
	    SETPAR(drH_1);
	    SETPAR(drH_2);
	    SETPAR(c_Av);
	    SETPAR(c_Bv);
	    SETPAR(c_Cv);
	    SETPAR(T_v);
	    SETPAR(T_vc);
	    SETPAR(E1R);
	    SETPAR(E2R);
#undef SETPAR
#undef CHECKPAR
	}
    }
    if(NULL != szOutFile) {
	NaPrintLog("cstr: state output file parametrs file is '%s'\n",
		   szOutFile);
	out = OpenOutputDataFile(szOutFile);
    }
}